

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.h
# Opt level: O2

bool StringFormatter<const_unsigned_char_&>::output_wchar<unsigned_char>(ostream *os,uchar *value)

{
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *src;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> wc;
  
  wc._M_dataplus._M_p = (pointer)&wc.field_2;
  std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>::
  _M_construct(&wc,1,(uint)*value);
  string::convert<char,std::__cxx11::wstring>(&local_50,(string *)&wc,src);
  std::operator<<(os,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::wstring::~wstring((wstring *)&wc);
  return true;
}

Assistant:

static bool output_wchar(std::ostream& os, const T& value)
    { 
        if constexpr (std::is_integral_v<T>) {
            std::basic_string<wchar_t> wc(1, wchar_t(value));
            os << string::convert<char>(wc);
            return true;
        }
        return false;
    }